

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap_str.c
# Opt level: O0

char * ap_str_find_first_char_from_set(char *str,char *set)

{
  size_t sVar1;
  size_t sVar2;
  ulong local_40;
  size_t j;
  size_t i;
  size_t set_len;
  size_t str_len;
  char *set_local;
  char *str_local;
  
  sVar1 = strlen(str);
  sVar2 = strlen(set);
  j = 0;
  do {
    if (sVar1 <= j) {
      return (char *)0x0;
    }
    for (local_40 = 0; local_40 < sVar2; local_40 = local_40 + 1) {
      if (str[j] == set[local_40]) {
        return str + j;
      }
    }
    j = j + 1;
  } while( true );
}

Assistant:

char * ap_str_find_first_char_from_set (char *str, const char *set)
{
	size_t str_len;
	size_t set_len;
	size_t i;
	size_t j;

	str_len = strlen (str);
	set_len = strlen (set);

	for (i = 0; i < str_len; i ++)
	{
		for (j = 0; j < set_len; j ++)
		{
			if (str[i] == set[j])
			{
				return str + i;
			}
		}
	}

	return NULL;
}